

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O2

void IoTHubTransport_MQTT_Common_Unsubscribe_DeviceMethod(TRANSPORT_LL_HANDLE handle)

{
  ushort uVar1;
  uint16_t packetId;
  int iVar2;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  char *unsubscribe [1];
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"IoTHubTransport_MQTT_Common_Unsubscribe_DeviceMethod",0xda2,1,
                 "Invalid argument to unsubscribe (NULL).");
      return;
    }
  }
  else if (*(STRING_HANDLE *)((long)handle + 0x28) != (STRING_HANDLE)0x0) {
    unsubscribe[0] = STRING_c_str(*(STRING_HANDLE *)((long)handle + 0x28));
    uVar1 = (ushort)*(undefined4 *)((long)handle + 0x80);
    packetId = 1;
    if (uVar1 < 0xfffe) {
      packetId = uVar1 + 1;
    }
    *(uint16_t *)((long)handle + 0x80) = packetId;
    iVar2 = mqtt_client_unsubscribe
                      (*(MQTT_CLIENT_HANDLE *)((long)handle + 0x70),packetId,unsubscribe,1);
    if (iVar2 != 0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"IoTHubTransport_MQTT_Common_Unsubscribe_DeviceMethod",0xd98,1,
                   "Failure calling mqtt_client_unsubscribe");
      }
    }
    STRING_delete(*(STRING_HANDLE *)((long)handle + 0x28));
    *(undefined8 *)((long)handle + 0x28) = 0;
    *(byte *)((long)handle + 0x30) = *(byte *)((long)handle + 0x30) & 0xf7;
  }
  return;
}

Assistant:

void IoTHubTransport_MQTT_Common_Unsubscribe_DeviceMethod(TRANSPORT_LL_HANDLE handle)
{
    PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    if (transport_data != NULL)
    {
        if (transport_data->topic_DeviceMethods != NULL)
        {
            const char* unsubscribe[1];
            unsubscribe[0] = STRING_c_str(transport_data->topic_DeviceMethods);

            if (mqtt_client_unsubscribe(transport_data->mqttClient, getNextPacketId(transport_data), unsubscribe, 1) != 0)
            {
                LogError("Failure calling mqtt_client_unsubscribe");
            }

            STRING_delete(transport_data->topic_DeviceMethods);
            transport_data->topic_DeviceMethods = NULL;
            transport_data->topics_ToSubscribe &= ~SUBSCRIBE_DEVICE_METHOD_TOPIC;
        }
    }
    else
    {
        LogError("Invalid argument to unsubscribe (NULL).");
    }
}